

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttdriver.c
# Opt level: O0

FT_Error tt_size_request(FT_Size size,FT_Size_Request req)

{
  FT_Error FVar1;
  int iVar2;
  FT_Long FVar3;
  uint local_54;
  uint local_50;
  FT_UInt resolution;
  FT_Error err;
  FT_ULong strike_index;
  SFNT_Service sfnt;
  TT_Face ttface;
  TT_Size pTStack_28;
  FT_Error error;
  TT_Size ttsize;
  FT_Size_Request req_local;
  FT_Size size_local;
  
  ttface._4_4_ = 0;
  pTStack_28 = (TT_Size)size;
  ttsize = (TT_Size)req;
  req_local = (FT_Size_Request)size;
  if ((size->face->face_flags & 2U) != 0) {
    sfnt = (SFNT_Service)size->face;
    strike_index = (FT_ULong)sfnt[2].load_sbit_image;
    ttface._4_4_ = (**(code **)(strike_index + 0xd0))(sfnt,req,&resolution);
    if (ttface._4_4_ == 0) {
      FVar1 = tt_size_select((FT_Size)req_local,_resolution);
      return FVar1;
    }
    pTStack_28->strike_index = 0xffffffff;
  }
  iVar2 = FT_Request_Metrics(*(FT_Face *)req_local,(FT_Size_Request)ttsize);
  if (((iVar2 == 0) && (iVar2 = ttface._4_4_, (*(ulong *)(*(long *)req_local + 0x10) & 1) != 0)) &&
     (ttface._4_4_ = tt_size_reset(pTStack_28,'\0'), iVar2 = ttface._4_4_, ttface._4_4_ == 0)) {
    if (pTStack_28->metrics->y_ppem < pTStack_28->metrics->x_ppem) {
      local_54._0_2_ = (ttsize->root).metrics.x_ppem;
      local_54._2_2_ = (ttsize->root).metrics.y_ppem;
    }
    else {
      local_54 = *(uint *)&(ttsize->root).metrics.field_0x4;
    }
    local_50 = local_54;
    if ((*(int *)&(ttsize->root).face == 4) || (local_54 == 0)) {
      local_50 = 0x48;
    }
    FVar3 = FT_MulDiv((ulong)(pTStack_28->ttmetrics).ppem,0x1200,(ulong)local_50);
    pTStack_28->point_size = FVar3;
    iVar2 = ttface._4_4_;
  }
  ttface._4_4_ = iVar2;
  return ttface._4_4_;
}

Assistant:

static FT_Error
  tt_size_request( FT_Size          size,
                   FT_Size_Request  req )
  {
    TT_Size   ttsize = (TT_Size)size;
    FT_Error  error  = FT_Err_Ok;


#ifdef TT_CONFIG_OPTION_EMBEDDED_BITMAPS

    if ( FT_HAS_FIXED_SIZES( size->face ) )
    {
      TT_Face       ttface = (TT_Face)size->face;
      SFNT_Service  sfnt   = (SFNT_Service)ttface->sfnt;
      FT_ULong      strike_index;


      error = sfnt->set_sbit_strike( ttface, req, &strike_index );

      if ( error )
        ttsize->strike_index = 0xFFFFFFFFUL;
      else
        return tt_size_select( size, strike_index );
    }

#endif /* TT_CONFIG_OPTION_EMBEDDED_BITMAPS */

    {
      FT_Error  err = FT_Request_Metrics( size->face, req );


      if ( err )
      {
        error = err;
        goto Exit;
      }
    }

    if ( FT_IS_SCALABLE( size->face ) )
    {
      error = tt_size_reset( ttsize, 0 );

#ifdef TT_USE_BYTECODE_INTERPRETER
      /* for the `MPS' bytecode instruction we need the point size */
      if ( !error )
      {
        FT_UInt  resolution =
                   ttsize->metrics->x_ppem > ttsize->metrics->y_ppem
                     ? req->horiResolution
                     : req->vertResolution;


        /* if we don't have a resolution value, assume 72dpi */
        if ( req->type == FT_SIZE_REQUEST_TYPE_SCALES ||
             !resolution                              )
          resolution = 72;

        ttsize->point_size = FT_MulDiv( ttsize->ttmetrics.ppem,
                                        64 * 72,
                                        resolution );
      }
#endif
    }

  Exit:
    return error;
  }